

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QRasterPaintEngineState::QRasterPaintEngineState(QRasterPaintEngineState *this)

{
  QPainterState *in_RDI;
  
  QPainterState::QPainterState(in_RDI);
  in_RDI->_vptr_QPainterState = (_func_int **)&PTR__QRasterPaintEngineState_00e1c8d0;
  QPen::QPen((QPen *)in_RDI);
  QSpanData::QSpanData((QSpanData *)in_RDI);
  QBrush::QBrush((QBrush *)in_RDI);
  QSpanData::QSpanData((QSpanData *)in_RDI);
  in_RDI[1].matrix.m_matrix[2][1] = 0.0;
  *(undefined4 *)&in_RDI[2].clipInfo.d.d = 0;
  *(undefined4 *)(in_RDI[1].matrix.m_matrix[2] + 2) = 0;
  *(undefined4 *)((long)&in_RDI[2].clipInfo.d.d + 4) = 0;
  *(undefined4 *)&in_RDI[2].clipInfo.d.ptr = 0x100;
  in_RDI[2].clipInfo.d.size = 0x3ff0000000000000;
  *(undefined4 *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) = 0;
  *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) =
       *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) & 0xfffd | 2;
  *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) =
       *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) & 0xfffb;
  *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) =
       *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) & 0xfff7;
  *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) =
       *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) & 0xffef;
  *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) =
       *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) & 0xffdf | 0x20;
  *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) =
       *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) & 0xffbf | 0x40;
  *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) =
       *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) & 0xff7f | 0x80;
  *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) =
       *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) & 0xfeff | 0x100;
  in_RDI[2].worldMatrix.m_matrix[0][0] = 0.0;
  *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) =
       *(ushort *)((long)in_RDI[2].worldMatrix.m_matrix[0] + 0xc) & 0xfffe;
  *(undefined4 *)(in_RDI[2].worldMatrix.m_matrix[0] + 1) = 0;
  return;
}

Assistant:

QRasterPaintEngineState::QRasterPaintEngineState()
{
    stroker = nullptr;

    fillFlags = 0;
    strokeFlags = 0;
    pixmapFlags = 0;

    intOpacity = 256;

    txscale = 1.;

    flag_bits = 0;
    flags.fast_pen = true;
    flags.non_complex_pen = false;
    flags.antialiased = false;
    flags.bilinear = false;
    flags.fast_text = true;
    flags.tx_noshear = true;
    flags.fast_images = true;
    flags.cosmetic_brush = true;

    clip = nullptr;
    flags.has_clip_ownership = false;

    dirty = 0;
}